

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral_enumeration_map.cpp
# Opt level: O1

int main(void)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 uVar3;
  _Hash_node_base *p_Var4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  uint64_t shift;
  void *__s;
  ulong uVar12;
  undefined4 *puVar13;
  undefined4 *puVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  ostream *poVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  value_type *__val;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  unsigned_long uVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  pair<kitty::static_truth_table<4U,_true>,_bool> pVar29;
  anon_class_16_2_3a34d4c8 __f;
  dynamic_truth_table map;
  static_truth_table<4U,_true> spectral;
  __tuple_element_t<0UL,_tuple<static_truth_table<4U,_true>,_unsigned_int,_vector<unsigned_char,_allocator<unsigned_char>_>_>_>
  f_npn;
  truth_table_map classes;
  ulong local_1b0;
  undefined1 local_198 [16];
  pointer local_188;
  uint32_t local_180;
  pointer local_178;
  long local_170;
  key_type local_168;
  ulong local_160;
  long local_158;
  undefined8 local_150;
  undefined8 local_148;
  static_truth_table<4U,_true> local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  undefined1 local_110 [16];
  miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> local_100;
  
  local_198 = (undefined1  [16])0x0;
  local_188 = (pointer)0x0;
  __s = operator_new(0x2000);
  local_198._8_8_ = __s;
  local_198._0_8_ = __s;
  lVar26 = 0;
  local_188 = (pointer)((long)__s + 0x2000);
  memset(__s,0,0x2000);
  local_198._8_8_ = (pointer)((long)__s + 0x2000);
  local_180 = 0x10;
  do {
    puVar1 = (uint *)((long)__s + lVar26 * 8);
    uVar11 = puVar1[1];
    uVar6 = puVar1[2];
    uVar7 = puVar1[3];
    puVar2 = (uint *)((long)__s + lVar26 * 8);
    *puVar2 = *puVar1 ^ 0xffffffff;
    puVar2[1] = uVar11 ^ 0xffffffff;
    puVar2[2] = uVar6 ^ 0xffffffff;
    puVar2[3] = uVar7 ^ 0xffffffff;
    lVar26 = lVar26 + 2;
  } while (lVar26 != 0x400);
  local_138._0_8_ = local_110 + 8;
  local_138._8_8_ = 1;
  local_128 = (undefined1  [16])0x0;
  local_118 = 1.0;
  local_110 = (undefined1  [16])0x0;
  uVar20 = 0;
  do {
    uVar11 = ~(uint)uVar20;
    uVar23 = (ulong)(ushort)uVar11;
    uVar21 = uVar20;
    if (uVar23 < uVar20) {
      uVar21 = uVar23;
    }
    uVar24 = *(ulong *)(local_198._0_8_ + (uVar20 >> 6) * 8);
    *(ulong *)(local_198._0_8_ + (uVar20 >> 6) * 8) = uVar24 & ~(1L << (uVar20 & 0x3f));
    uVar22 = (ulong)(uVar11 >> 3 & 0x1ff8);
    uVar12 = *(ulong *)(local_198._0_8_ + uVar22);
    uVar19 = (ulong)((uint)((uVar12 >> ((ulong)uVar11 & 0x3f) & 1) != 0) +
                    (uint)((uVar24 >> (uVar20 & 0x3f) & 1) != 0));
    *(ulong *)(local_198._0_8_ + uVar22) = uVar12 & ~(1L << ((ulong)uVar11 & 0x3f));
    uVar9 = kitty::detail::swaps._56_8_;
    uVar8 = kitty::detail::swaps._48_8_;
    local_148 = kitty::detail::swaps._56_8_;
    uVar12 = kitty::detail::swaps._56_8_ - kitty::detail::swaps._48_8_;
    uVar24 = uVar20;
    if (uVar12 == 0) {
      local_1b0 = 0xffffffff;
    }
    else {
      local_1b0 = 0xffffffff;
      uVar22 = 0;
      do {
        uVar18 = (ulong)*(byte *)(uVar8 + uVar22);
        bVar5 = (byte)(1L << (*(byte *)(uVar8 + uVar22) & 0x3f));
        uVar24 = (uVar24 & *(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 0x10)) >>
                 (bVar5 & 0x3f) |
                 (*(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 8) & uVar24) <<
                 (bVar5 & 0x3f) |
                 *(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18) & uVar24;
        uVar23 = (*(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 0x10) & uVar23) >>
                 (bVar5 & 0x3f) |
                 (*(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 8) & uVar23) <<
                 (bVar5 & 0x3f) |
                 *(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18) & uVar23;
        uVar18 = *(ulong *)(local_198._0_8_ + (uVar24 >> 6) * 8);
        *(ulong *)(local_198._0_8_ + (uVar24 >> 6) * 8) = uVar18 & ~(1L << (uVar24 & 0x3f));
        uVar19 = (ulong)((int)uVar19 + (uint)((uVar18 >> (uVar24 & 0x3f) & 1) != 0) +
                        (uint)((*(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) >> (uVar23 & 0x3f) &
                               1) != 0));
        *(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) =
             *(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) & ~(1L << (uVar23 & 0x3f));
        uVar18 = uVar24;
        if (uVar23 < uVar24) {
          uVar18 = uVar23;
        }
        if (uVar23 < uVar21 || uVar24 < uVar21) {
          local_1b0 = uVar22 & 0xffffffff;
          uVar21 = uVar18;
        }
        uVar22 = uVar22 + 1;
      } while (uVar12 != uVar22);
    }
    uVar10 = kitty::detail::flips._48_8_;
    local_150 = kitty::detail::flips._48_8_;
    lVar26 = kitty::detail::flips._56_8_ - kitty::detail::flips._48_8_;
    uVar25 = uVar19;
    if (lVar26 != 0) {
      local_178 = (pointer)local_198._0_8_;
      local_158 = lVar26 + (ulong)(lVar26 == 0);
      lVar26 = 0;
      do {
        local_170 = lVar26;
        uVar24 = uVar24 >> 1 & 0x2222222222222222 |
                 uVar24 * 2 & 0x4444444444444444 | uVar24 & 0x9999999999999999;
        bVar5 = (byte)(1L << (*(byte *)(uVar10 + local_170) & 0x3f));
        uVar22 = *(ulong *)(kitty::detail::projections + (ulong)*(byte *)(uVar10 + local_170) * 8);
        uVar23 = uVar23 >> 1 & 0x2222222222222222 |
                 uVar23 * 2 & 0x4444444444444444 | uVar23 & 0x9999999999999999;
        uVar24 = (uVar24 & uVar22) >> (bVar5 & 0x3f) | uVar24 << (bVar5 & 0x3f) & uVar22;
        uVar23 = (uVar23 & uVar22) >> (bVar5 & 0x3f) | uVar23 << (bVar5 & 0x3f) & uVar22;
        uVar22 = *(ulong *)(local_198._0_8_ + (uVar24 >> 6) * 8);
        *(ulong *)(local_198._0_8_ + (uVar24 >> 6) * 8) = uVar22 & ~(1L << (uVar24 & 0x3f));
        uVar11 = (uint)((uVar22 >> (uVar24 & 0x3f) & 1) != 0) + (int)uVar19 +
                 (uint)((*(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) >> (uVar23 & 0x3f) & 1) !=
                       0);
        bVar27 = uVar21 <= uVar24;
        bVar28 = uVar21 <= uVar23;
        uVar22 = uVar24;
        if (uVar23 < uVar24) {
          uVar22 = uVar23;
        }
        if (bVar28 && bVar27) {
          uVar22 = uVar21;
        }
        uVar21 = uVar22;
        *(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) =
             *(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) & ~(1L << (uVar23 & 0x3f));
        if (!bVar28 || !bVar27) {
          local_1b0 = 0xffffffff;
        }
        if (uVar9 != uVar8) {
          uVar22 = 0;
          do {
            uVar19 = (ulong)*(byte *)(uVar8 + uVar22);
            bVar5 = (byte)(1L << (*(byte *)(uVar8 + uVar22) & 0x3f));
            uVar24 = (uVar24 & *(ulong *)(kitty::detail::permutation_masks + uVar19 * 0x18 + 0x10))
                     >> (bVar5 & 0x3f) |
                     (*(ulong *)(kitty::detail::permutation_masks + uVar19 * 0x18 + 8) & uVar24) <<
                     (bVar5 & 0x3f) |
                     *(ulong *)(kitty::detail::permutation_masks + uVar19 * 0x18) & uVar24;
            uVar23 = (*(ulong *)(kitty::detail::permutation_masks + uVar19 * 0x18 + 0x10) & uVar23)
                     >> (bVar5 & 0x3f) |
                     (*(ulong *)(kitty::detail::permutation_masks + uVar19 * 0x18 + 8) & uVar23) <<
                     (bVar5 & 0x3f) |
                     *(ulong *)(kitty::detail::permutation_masks + uVar19 * 0x18) & uVar23;
            uVar19 = *(ulong *)(local_198._0_8_ + (uVar24 >> 6) * 8);
            *(ulong *)(local_198._0_8_ + (uVar24 >> 6) * 8) = uVar19 & ~(1L << (uVar24 & 0x3f));
            uVar11 = uVar11 + ((uVar19 >> (uVar24 & 0x3f) & 1) != 0) +
                     (uint)((*(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) >> (uVar23 & 0x3f) & 1)
                           != 0);
            uVar19 = uVar24;
            if (uVar23 < uVar24) {
              uVar19 = uVar23;
            }
            *(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) =
                 *(ulong *)(local_198._0_8_ + (uVar23 >> 6) * 8) & ~(1L << (uVar23 & 0x3f));
            if (uVar23 < uVar21 || uVar24 < uVar21) {
              local_1b0 = uVar22;
              uVar21 = uVar19;
            }
            local_1b0 = local_1b0 & 0xffffffff;
            uVar22 = uVar22 + 1;
          } while (uVar12 + (uVar12 == 0) != uVar22);
        }
        uVar19 = (ulong)uVar11;
        uVar25 = (unsigned_long)uVar11;
        lVar26 = local_170 + 1;
      } while (local_170 + 1 != local_158);
    }
    local_160 = uVar20;
    puVar13 = (undefined4 *)operator_new(4);
    *puVar13 = 0x3020100;
    uVar8 = kitty::detail::swaps._48_8_;
    if (-1 < (int)local_1b0) {
      uVar20 = 0;
      do {
        uVar23 = (ulong)*(byte *)(uVar8 + uVar20);
        uVar3 = *(undefined1 *)((long)puVar13 + uVar23);
        *(undefined1 *)((long)puVar13 + uVar23) = *(undefined1 *)((long)puVar13 + uVar23 + 1);
        *(undefined1 *)((long)puVar13 + uVar23 + 1) = uVar3;
        uVar20 = uVar20 + 1;
      } while ((int)local_1b0 + 1 != uVar20);
    }
    puVar14 = (undefined4 *)operator_new(4);
    *puVar14 = *puVar13;
    operator_delete(puVar13,4);
    local_140._bits = uVar21;
    operator_delete(puVar14,4);
    kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::
    miller_spectral_canonization_impl(&local_100,&local_140,true,true,true);
    pVar29 = kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>>::
             run<void(&)(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
                       ((miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>> *)
                        &local_100,kitty::detail::exact_spectral_canonization_null_callback);
    uVar20 = local_160;
    kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::
    ~miller_spectral_canonization_impl(&local_100);
    local_168._bits = pVar29.first._bits._bits;
    iVar15 = std::
             _Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_138,&local_168);
    if (iVar15.
        super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pmVar16 = std::__detail::
                _Map_base<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_138,&local_168);
      pmVar16->first = 1;
      pmVar16->second = uVar25;
    }
    else {
      *(long *)((long)iVar15.
                      super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                      ._M_cur + 0x10) =
           *(long *)((long)iVar15.
                           super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                           ._M_cur + 0x10) + 1;
      *(unsigned_long *)
       ((long)iVar15.
              super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
              ._M_cur + 0x18) =
           uVar25 + *(long *)((long)iVar15.
                                    super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                                    ._M_cur + 0x18);
    }
    uVar20 = kitty::find_first_one_bit<kitty::dynamic_truth_table>
                       ((dynamic_truth_table *)local_198,uVar20);
  } while (uVar20 != 0xffffffffffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[i] enumerated ",0xf);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," functions into ",0x10);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," classes.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[i] detailed classes:",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  for (p_Var4 = (_Hash_node_base *)local_128._0_8_; p_Var4 != (_Hash_node_base *)0x0;
      p_Var4 = p_Var4->_M_nxt) {
    __f.chunk_size = 4;
    __f.os = (ostream *)&std::cout;
    std::
    for_each<unsigned_long_const*,kitty::print_hex<kitty::static_truth_table<4u,true>,void>(kitty::static_truth_table<4u,true>const&,std::ostream&)::_lambda(auto:1)_1_>
              ((unsigned_long *)(p_Var4 + 1),(unsigned_long *)(p_Var4 + 2),__f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
    kitty::print_spectrum<kitty::static_truth_table<4u,true>>
              ((static_truth_table<4U,_true> *)(p_Var4 + 1),(ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 8;
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    *(undefined8 *)(poVar17 + *(long *)(*(long *)poVar17 + -0x18) + 0x10) = 8;
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  std::
  _Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_138);
  if ((pointer)local_198._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._0_8_,(long)local_188 - local_198._0_8_);
  }
  return 0;
}

Assistant:

int main()
{
  static_assert( num_vars <= 5, "number of variables is limited to 5" );

  /* set to store all visited functions during NPN canonization (dynamic to store bits on heap) */
  kitty::dynamic_truth_table map( truth_table::NumBits );

  /* invert bits: 1 means not classified yet */
  std::transform( map.cbegin(), map.cend(), map.begin(), []( auto word ) { return ~word; } );

  /* set to store all NPN and spectral representatives */
  using truth_table_map = std::unordered_map<truth_table, std::pair<uint64_t, uint64_t>, kitty::hash<truth_table>>;
  truth_table_map classes;

  /* start from 0 */
  int64_t index = 0;
  truth_table tt;

  /* for counting the classes and functions */
  //uint64_t ones = map.num_bits();

  auto ctr = 0, bctr = 0;

  while ( index != -1 )
  {
    /* create truth table from index value */
    kitty::create_from_words( tt, &index, &index + 1 );

    /* apply NPN canonization and add resulting representative to set;
       also cross out all the visited functions */
    auto func_count = 0u;
    const auto f_npn = std::get<0>( kitty::exact_npn_canonization( tt,
                                                                   [&map, &func_count]( const auto& tt ) {
                                                                     func_count += kitty::get_bit( map, *tt.cbegin() );
                                                                     kitty::clear_bit( map, *tt.cbegin() ); } ) );

    //auto new_ones = count_ones( map );
    //auto func_count = ones - new_ones;
    //ones = new_ones;

    const auto spectral = kitty::exact_spectral_canonization( f_npn );

    auto it = classes.find( spectral );

    if ( it == classes.end() )
    {
      classes[spectral] = {1u, func_count};
    }
    else
    {
      it->second.first++;
      it->second.second += func_count;
    }

    if ( progress )
    {
      std::cout << ".";

      if ( ++ctr == 100 )
      {
        std::cout << " " << ++bctr << std::endl;
        ctr = 0;
      }
    }

    /* find next non-classified truth table */
    index = find_first_one_bit( map, index );
  }

  if ( progress )
  {
    std::cout << std::endl;
  }

  std::cout << "[i] enumerated "
            << map.num_bits() << " functions into "
            << classes.size() << " classes." << std::endl;

  std::cout << "[i] detailed classes:" << std::endl;

  for ( const auto& p : classes )
  {
    print_hex( p.first );
    std::cout << "   ";
    print_spectrum( p.first );
    std::cout << " " << std::setw( 8 ) << p.second.first << " " << std::setw( 8 ) << p.second.second << std::endl;
  }

  return 0;
}